

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O3

insert_result __thiscall
tonk::LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::insert
          (LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *this,uint *k,
          IConnection **v)

{
  uint uVar1;
  uint uVar2;
  raw_node *prVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar2 = this->m_values_count;
  if (uVar2 == 0) {
LAB_0012088e:
    uVar5 = 4;
    if (4 < uVar2 * 2) {
      uVar5 = uVar2 * 2;
    }
    rehash(this,uVar5);
    if (this->m_values_count != 0) {
      uVar5 = *k;
      uVar2 = uVar5 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
      prVar3 = this->m_values + uVar2;
      uVar6 = uVar2;
      if (prVar3->m_bits[0x10] != '\0') {
        if (*(uint *)prVar3->m_bits != uVar5) {
          uVar1 = this->m_values_count - 1;
          uVar4 = 0;
          do {
            bVar7 = uVar6 == 0;
            prVar3 = prVar3 + -1;
            uVar6 = uVar6 - 1;
            if (bVar7) {
              prVar3 = this->m_values + uVar1;
              uVar6 = uVar1;
            }
            if (uVar2 == uVar6) goto LAB_00120939;
            if (prVar3->m_bits[0x10] == '\0') goto LAB_0012090e;
          } while (*(uint *)prVar3->m_bits != uVar5);
          goto LAB_0012093b;
        }
        goto LAB_001208d4;
      }
LAB_0012090e:
      uVar1 = this->m_num_valid;
      if (uVar1 < this->m_grow_threshold) goto LAB_00120916;
    }
LAB_00120939:
    uVar4 = 0;
    uVar6 = 0;
  }
  else {
    uVar5 = *k;
    uVar1 = uVar5 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
    prVar3 = this->m_values + uVar1;
    uVar6 = uVar1;
    if (prVar3->m_bits[0x10] == '\0') {
LAB_00120882:
      uVar1 = this->m_num_valid;
      if (this->m_grow_threshold <= uVar1) goto LAB_0012088e;
LAB_00120916:
      *(uint *)prVar3->m_bits = uVar5;
      *(IConnection **)(prVar3->m_bits + 8) = *v;
      prVar3->m_bits[0x10] = '\x01';
      this->m_num_valid = uVar1 + 1;
      uVar4 = 0x100000000;
      goto LAB_0012093b;
    }
    if (*(uint *)prVar3->m_bits != uVar5) {
      uVar4 = 0;
      do {
        bVar7 = uVar6 == 0;
        prVar3 = prVar3 + -1;
        uVar6 = uVar6 - 1;
        if (bVar7) {
          prVar3 = this->m_values + (uVar2 - 1);
          uVar6 = uVar2 - 1;
        }
        if (uVar1 == uVar6) goto LAB_0012088e;
        if (prVar3->m_bits[0x10] == '\0') goto LAB_00120882;
      } while (*(uint *)prVar3->m_bits != uVar5);
      goto LAB_0012093b;
    }
LAB_001208d4:
    uVar4 = 0;
  }
LAB_0012093b:
  return (insert_result)(uVar6 | uVar4);
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value())
    {
        insert_result result;
        if (!insert_no_grow(result, k, v))
        {
            unsigned newSize = m_values_count * 2;
            if (newSize < cMinHashSize) {
                newSize = cMinHashSize;
            }

            rehash(newSize);

            if (!insert_no_grow(result, k, v)) {
                TONK_DEBUG_BREAK();
            }
        }

        return result;
    }